

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayappend(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQInteger SVar2;
  HSQUIRRELVM in_RDI;
  SQObjectPtr **unaff_retaddr;
  SQObjectPtr *arr;
  SQVM *in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 2) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    local_8 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(v,idx,arr._4_4_,unaff_retaddr);
    if (bVar1) {
      SQVM::GetUp(in_stack_ffffffffffffffe0,
                  (in_stack_ffffffffffffffe0->super_SQCollectable).super_SQRefCounted._uiRef);
      SQArray::Append((SQArray *)idx,(SQObject *)CONCAT44(arr._4_4_,arr._0_4_));
      SQVM::Pop((SQVM *)0x10e458);
      local_8 = 0;
    }
    else {
      local_8 = -1;
    }
  }
  return local_8;
}

Assistant:

SQRESULT sq_arrayappend(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v,2);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    _array(*arr)->Append(v->GetUp(-1));
    v->Pop();
    return SQ_OK;
}